

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TruthGetParams(char *pFileName,int *pnVars,int *pnTruths)

{
  char *pcVar1;
  int local_34;
  int local_30;
  int nLines;
  int nVars;
  int i;
  char *pContents;
  int *pnTruths_local;
  int *pnVars_local;
  char *pFileName_local;
  
  if (pnVars != (int *)0x0) {
    *pnVars = 0;
  }
  if (pnTruths != (int *)0x0) {
    *pnTruths = 0;
  }
  pcVar1 = Abc_FileRead(pFileName);
  if (pcVar1 != (char *)0x0) {
    for (nLines = 0;
        (((pcVar1[nLines] != '\0' && (pcVar1[nLines] != ' ')) && (pcVar1[nLines] != '\n')) &&
        (pcVar1[nLines] != '\r')); nLines = nLines + 1) {
    }
    if (pcVar1[nLines] == '\0') {
      printf("Strange, the input file does not have spaces and new-lines...\n");
    }
    if ((*pcVar1 == '0') && (pcVar1[1] == 'x')) {
      nLines = nLines + -2;
    }
    for (local_30 = 0; (local_30 < 0x20 && (nLines << 2 != 1 << ((byte)local_30 & 0x1f)));
        local_30 = local_30 + 1) {
    }
    if ((local_30 < 2) || (0x10 < local_30)) {
      printf("Does not look like the input file contains truth tables...\n");
    }
    else {
      if (pnVars != (int *)0x0) {
        *pnVars = local_30;
      }
      local_34 = 0;
      for (nLines = 0; pcVar1[nLines] != '\0'; nLines = nLines + 1) {
        local_34 = (uint)(pcVar1[nLines] == '\n') + local_34;
      }
      if (pnTruths != (int *)0x0) {
        *pnTruths = local_34;
      }
    }
  }
  return;
}

Assistant:

void Abc_TruthGetParams( char * pFileName, int * pnVars, int * pnTruths )
{
    char * pContents;
    int i, nVars, nLines;
    // prepare the output 
    if ( pnVars )
        *pnVars = 0;
    if ( pnTruths )
        *pnTruths = 0;
    // read data from file
    pContents = Abc_FileRead( pFileName );
    if ( pContents == NULL )
        return;
    // count the number of symbols before the first space or new-line
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    for ( i = 0; pContents[i]; i++ )
        if ( pContents[i] == ' ' || pContents[i] == '\n' || pContents[i] == '\r' )
            break;
    if ( pContents[i] == 0 )
        printf( "Strange, the input file does not have spaces and new-lines...\n" );

    // acount for the fact that truth tables may have "0x" at the beginning of each line
    if ( pContents[0] == '0' && pContents[1] == 'x' )
        i = i - 2;

    // determine the number of variables
    for ( nVars = 0; nVars < 32; nVars++ )
        if ( 4 * i == (1 << nVars) ) // the number of bits equal to the size of truth table
            break;
    if ( nVars < 2 || nVars > 16 )
    {
        printf( "Does not look like the input file contains truth tables...\n" );
        return;
    }
    if ( pnVars )
        *pnVars = nVars;

    // determine the number of functions by counting the lines
    nLines = 0;
    for ( i = 0; pContents[i]; i++ )
        nLines += (pContents[i] == '\n');
    if ( pnTruths )
        *pnTruths = nLines;
    ABC_FREE( pContents );
}